

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O3

void __thiscall amrex::FabArrayBase::flushFPinfo(FabArrayBase *this,bool no_assertion)

{
  BARef *pBVar1;
  Ref *pRVar2;
  iterator iVar3;
  long lVar4;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  _Var5;
  const_iterator __last;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  *p_Var6;
  key_type *__k;
  FPinfo *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
  pVar7;
  vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>
  others;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  *local_58;
  iterator iStack_50;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  *local_48;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  local_40;
  const_iterator local_38;
  
  local_58 = (_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
              *)0x0;
  iStack_50._M_current =
       (_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
        *)0x0;
  local_48 = (_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
              *)0x0;
  pVar7 = std::
          _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
          ::equal_range((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                         *)m_TheFillPatchCache,&this->m_bdkey);
  __last._M_node = (_Base_ptr)pVar7.second._M_node;
  _Var5 = pVar7.first._M_node;
  local_38._M_node = _Var5._M_node;
  if (_Var5._M_node != __last._M_node) {
    do {
      this_00 = (FPinfo *)_Var5._M_node[1]._M_left;
      pBVar1 = (this_00->m_srcbdk).m_ba_id.data;
      pRVar2 = (this_00->m_srcbdk).m_dm_id.data;
      if ((pBVar1 != (this_00->m_dstbdk).m_ba_id.data) ||
         (pRVar2 != (this_00->m_dstbdk).m_dm_id.data)) {
        __k = &this_00->m_dstbdk;
        if (pRVar2 != (this->m_bdkey).m_dm_id.data || pBVar1 != (this->m_bdkey).m_ba_id.data) {
          __k = &this_00->m_srcbdk;
        }
        pVar7 = std::
                _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                ::equal_range((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                               *)m_TheFillPatchCache,__k);
        for (local_40 = pVar7.first._M_node; local_40._M_node != pVar7.second._M_node._M_node;
            local_40._M_node = (_Base_ptr)std::_Rb_tree_increment(local_40._M_node)) {
          if (_Var5._M_node[1]._M_left == local_40._M_node[1]._M_left) {
            if (iStack_50._M_current == local_48) {
              std::
              vector<std::_Rb_tree_iterator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::allocator<std::_Rb_tree_iterator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>>
              ::
              _M_realloc_insert<std::_Rb_tree_iterator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>const&>
                        ((vector<std::_Rb_tree_iterator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::allocator<std::_Rb_tree_iterator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>>
                          *)&local_58,iStack_50,&local_40);
            }
            else {
              (iStack_50._M_current)->_M_node = local_40._M_node;
              iStack_50._M_current = iStack_50._M_current + 1;
            }
          }
        }
        this_00 = (FPinfo *)_Var5._M_node[1]._M_left;
      }
      m_FPinfo_stats = m_FPinfo_stats + -1;
      _DAT_0071af78 = _DAT_0071af78 + 1;
      lVar4 = this_00->m_nuse;
      if (this_00->m_nuse < DAT_0071af60) {
        lVar4 = DAT_0071af60;
      }
      DAT_0071af60 = lVar4;
      FPinfo::~FPinfo(this_00);
      operator_delete(this_00,0x148);
      _Var5._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var5._M_node);
    } while (_Var5._M_node != __last._M_node);
  }
  std::
  _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
  ::_M_erase_aux((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                  *)m_TheFillPatchCache,local_38,__last);
  iVar3._M_current =
       (_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
        *)iStack_50;
  for (p_Var6 = local_58; p_Var6 != iVar3._M_current; p_Var6 = p_Var6 + 1) {
    std::
    _Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
    ::erase_abi_cxx11_((_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
                        *)m_TheFillPatchCache,p_Var6->_M_node);
  }
  if (local_58 !=
      (_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
       *)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return;
}

Assistant:

void
FabArrayBase::flushFPinfo (bool no_assertion)
{
    amrex::ignore_unused(no_assertion);
    BL_ASSERT(no_assertion || getBDKey() == m_bdkey);

    std::vector<FPinfoCacheIter> others;

    std::pair<FPinfoCacheIter,FPinfoCacheIter> er_it = m_TheFillPatchCache.equal_range(m_bdkey);

    for (FPinfoCacheIter it = er_it.first; it != er_it.second; ++it)
    {
        const BDKey& srckey = it->second->m_srcbdk;
        const BDKey& dstkey = it->second->m_dstbdk;

        BL_ASSERT((srckey==dstkey && srckey==m_bdkey) ||
                  (m_bdkey==srckey) || (m_bdkey==dstkey));

        if (srckey != dstkey) {
            const BDKey& otherkey = (m_bdkey == srckey) ? dstkey : srckey;
            std::pair<FPinfoCacheIter,FPinfoCacheIter> o_er_it = m_TheFillPatchCache.equal_range(otherkey);

            for (FPinfoCacheIter oit = o_er_it.first; oit != o_er_it.second; ++oit)
            {
                if (it->second == oit->second)
                    others.push_back(oit);
            }
        }

#ifdef AMREX_MEM_PROFILING
        m_FPinfo_stats.bytes -= it->second->bytes();
#endif
        m_FPinfo_stats.recordErase(it->second->m_nuse);
        delete it->second;
    }

    m_TheFillPatchCache.erase(er_it.first, er_it.second);

    for (std::vector<FPinfoCacheIter>::iterator it = others.begin(),
             End = others.end(); it != End; ++it)
    {
        m_TheFillPatchCache.erase(*it);
    }
}